

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

_Bool Curl_ossl_data_pending(connectdata *conn,int connindex)

{
  int iVar1;
  ssl_connect_data *proxyssl;
  ssl_connect_data *connssl;
  int connindex_local;
  connectdata *conn_local;
  
  if (((conn->ssl[connindex].backend)->handle != (SSL *)0x0) &&
     (iVar1 = SSL_pending((SSL *)(conn->ssl[connindex].backend)->handle), iVar1 != 0)) {
    return true;
  }
  if (((conn->proxy_ssl[connindex].backend)->handle != (SSL *)0x0) &&
     (iVar1 = SSL_pending((SSL *)(conn->proxy_ssl[connindex].backend)->handle), iVar1 != 0)) {
    return true;
  }
  return false;
}

Assistant:

static bool Curl_ossl_data_pending(const struct connectdata *conn,
                                   int connindex)
{
  const struct ssl_connect_data *connssl = &conn->ssl[connindex];
  const struct ssl_connect_data *proxyssl = &conn->proxy_ssl[connindex];

  if(connssl->backend->handle && SSL_pending(connssl->backend->handle))
    return TRUE;

  if(proxyssl->backend->handle && SSL_pending(proxyssl->backend->handle))
    return TRUE;

  return FALSE;
}